

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O2

void __thiscall
LongReadsMapper::map_reads
          (LongReadsMapper *this,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *readIDs)

{
  pointer pLVar1;
  pointer this_00;
  bool bVar2;
  SatKmerIndex *this_01;
  NKmerIndex *this_02;
  ostream *poVar3;
  size_type sVar4;
  char *seq;
  ulong *puVar5;
  ulong uVar6;
  uint64_t i;
  ulong __n;
  size_type __n_00;
  LongReadsMapper *this_03;
  uint uVar7;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *threadm;
  long lVar8;
  reference rVar9;
  uint local_390;
  allocator_type local_389;
  vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  read_kmers;
  shared_ptr<SatKmerIndex> skindex;
  shared_ptr<NKmerIndex> nkindex;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  node_matches;
  vector<unsigned_char,_std::allocator<unsigned_char>_> candidate_counts;
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  thread_mappings;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> blocks;
  ReadSequenceBuffer sequenceGetter;
  StreamKmerFactory skf;
  
  pLVar1 = (this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl
      .super__Vector_impl_data._M_finish != pLVar1) {
    (this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
    super__Vector_impl_data._M_finish = pLVar1;
  }
  nkindex.super___shared_ptr<NKmerIndex,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  nkindex.super___shared_ptr<NKmerIndex,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  skindex.super___shared_ptr<SatKmerIndex,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  skindex.super___shared_ptr<SatKmerIndex,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this->sat_kmer_index == true) {
    this_01 = (SatKmerIndex *)operator_new(0x38);
    SatKmerIndex::SatKmerIndex(this_01,this->sg,this->k,(uint8_t)this->max_index_freq);
    std::__shared_ptr<SatKmerIndex,_(__gnu_cxx::_Lock_policy)2>::reset<SatKmerIndex>
              (&skindex.super___shared_ptr<SatKmerIndex,_(__gnu_cxx::_Lock_policy)2>,this_01);
  }
  else {
    this_02 = (NKmerIndex *)operator_new(0x50);
    NKmerIndex::NKmerIndex(this_02,this->sg,this->k,this->max_index_freq);
    std::__shared_ptr<NKmerIndex,_(__gnu_cxx::_Lock_policy)2>::reset<NKmerIndex>
              (&nkindex.super___shared_ptr<NKmerIndex,_(__gnu_cxx::_Lock_policy)2>,this_02);
  }
  std::
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ::vector(&thread_mappings,1,(allocator_type *)&skf);
  KMerFactory::KMerFactory(&skf.super_KMerFactory,this->k);
  this_00 = thread_mappings.
            super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  read_kmers.
  super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  read_kmers.
  super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  read_kmers.
  super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ReadSequenceBuffer::ReadSequenceBuffer(&sequenceGetter,this->datastore,0x1e00000,0x400000);
  node_matches.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  node_matches.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  node_matches.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&candidate_counts,
             (((long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x38) * 2,(allocator_type *)&blocks);
  uVar7 = 0;
  for (local_390 = 1;
      (ulong)local_390 <=
      ((long)(this->datastore->read_to_fileRecord).
             super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->datastore->read_to_fileRecord).
             super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
             super__Vector_impl_data._M_start >> 4) - 1U; local_390 = local_390 + 1) {
    uVar7 = uVar7 + 1;
    if (uVar7 % 10000 == 0) {
      poVar3 = sdglib::OutputLog(INFO,true);
      poVar3 = std::operator<<(poVar3,"Thread #");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
      poVar3 = std::operator<<(poVar3," processing its read #");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    if (((*(long *)(readIDs + 0x18) == 0) ||
        (sVar4 = std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)readIDs,&local_390), sVar4 != 0)) &&
       ((uint)(this->min_size * 2) <=
        (this->datastore->read_to_fileRecord).
        super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
        super__Vector_impl_data._M_start[local_390].record_size)) {
      seq = ReadSequenceBuffer::get_read_sequence(&sequenceGetter,(ulong)local_390);
      if (read_kmers.
          super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          read_kmers.
          super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        read_kmers.
        super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             read_kmers.
             super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      this_03 = (LongReadsMapper *)&skf;
      StreamKmerFactory::produce_all_kmers((StreamKmerFactory *)this_03,seq,&read_kmers);
      __n_00 = (long)read_kmers.
                     super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)read_kmers.
                     super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4;
      if ((ulong)((long)this->min_size * 2) <= __n_00) {
        if (this->sat_kmer_index == true) {
          get_sat_kmer_matches
                    (this_03,skindex.super___shared_ptr<SatKmerIndex,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,&node_matches,&read_kmers);
        }
        else {
          std::vector<bool,_std::allocator<bool>_>::vector
                    ((vector<bool,_std::allocator<bool>_> *)&blocks,__n_00,&local_389);
          lVar8 = 8;
          for (__n = 0; __n < (ulong)((long)read_kmers.
                                            super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)read_kmers.
                                            super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 4);
              __n = __n + 1) {
            bVar2 = NKmerIndex::filter(nkindex.
                                       super___shared_ptr<NKmerIndex,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_ptr,*(uint64_t *)
                                               (&(read_kmers.
                                                  super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->first
                                               + lVar8));
            rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                              ((vector<bool,_std::allocator<bool>_> *)&blocks,__n);
            puVar5 = rVar9._M_p;
            if (bVar2) {
              uVar6 = rVar9._M_mask | *puVar5;
            }
            else {
              uVar6 = ~rVar9._M_mask & *puVar5;
            }
            *puVar5 = uVar6;
            lVar8 = lVar8 + 0x10;
          }
          get_all_kmer_matches
                    (this,nkindex.super___shared_ptr<NKmerIndex,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     &node_matches,&read_kmers,(vector<bool,_std::allocator<bool>_> *)&blocks);
          std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                    ((_Bvector_base<std::allocator<bool>_> *)&blocks);
        }
        count_candidates(this,&candidate_counts,&node_matches,
                         (uint32_t)
                         ((ulong)((long)read_kmers.
                                        super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)read_kmers.
                                       super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4));
        alignment_blocks(&blocks,this,local_390,&node_matches,
                         (uint32_t)
                         ((ulong)((long)read_kmers.
                                        super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)read_kmers.
                                       super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4),
                         &candidate_counts);
        memset(candidate_counts.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,0,
               (long)candidate_counts.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)candidate_counts.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
        std::vector<LongReadMapping,std::allocator<LongReadMapping>>::
        insert<__gnu_cxx::__normal_iterator<LongReadMapping_const*,std::vector<LongReadMapping,std::allocator<LongReadMapping>>>,void>
                  ((vector<LongReadMapping,std::allocator<LongReadMapping>> *)this_00,
                   (this_00->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
                   _M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<const_LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
                    )blocks.super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<const_LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
                    )blocks.super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
        std::_Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>::~_Vector_base
                  ((_Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_> *)&blocks);
      }
    }
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&candidate_counts.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::~vector(&node_matches);
  ReadSequenceBuffer::~ReadSequenceBuffer(&sequenceGetter);
  std::
  _Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>::
  ~_Vector_base(&read_kmers.
                 super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
               );
  poVar3 = sdglib::OutputLog(INFO,true);
  poVar3 = std::operator<<(poVar3,"Read results:    ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," no match    ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," single match    ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," multi matches");
  std::endl<char,std::char_traits<char>>(poVar3);
  for (; thread_mappings.
         super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         thread_mappings.
         super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
      thread_mappings.
      super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           thread_mappings.
           super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) {
    std::vector<LongReadMapping,std::allocator<LongReadMapping>>::
    insert<__gnu_cxx::__normal_iterator<LongReadMapping*,std::vector<LongReadMapping,std::allocator<LongReadMapping>>>,void>
              ((vector<LongReadMapping,std::allocator<LongReadMapping>> *)&this->mappings,
               (this->mappings).
               super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
               super__Vector_impl_data._M_finish,
               ((thread_mappings.
                 super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>)._M_impl.
               super__Vector_impl_data._M_start,
               ((thread_mappings.
                 super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>)._M_impl.
               super__Vector_impl_data._M_finish);
  }
  poVar3 = sdglib::OutputLog(INFO,true);
  poVar3 = std::operator<<(poVar3,"Updating mapping indexes");
  std::endl<char,std::char_traits<char>>(poVar3);
  update_indexes(this);
  std::
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ::~vector(&thread_mappings);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&skindex.super___shared_ptr<SatKmerIndex,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&nkindex.super___shared_ptr<NKmerIndex,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void LongReadsMapper::map_reads(const std::unordered_set<uint32_t> &readIDs) {
    mappings.clear();
    std::shared_ptr<NKmerIndex> nkindex;
    std::shared_ptr<SatKmerIndex> skindex;
    if (sat_kmer_index) skindex.reset(new SatKmerIndex(sg,k,max_index_freq));
    else nkindex.reset(new NKmerIndex(sg,k,max_index_freq));
    std::vector<std::vector<LongReadMapping>> thread_mappings(omp_get_max_threads());
    uint32_t num_reads_done(0);
    uint64_t no_matches(0),single_matches(0),multi_matches(0);
#pragma omp parallel
    {
        StreamKmerFactory skf(k);
        std::vector<std::pair<bool, uint64_t>> read_kmers;

        auto & private_results=thread_mappings[omp_get_thread_num()];
        ReadSequenceBuffer sequenceGetter(datastore);
        std::vector<std::vector<std::pair<int32_t, int32_t>>> node_matches; //node, offset
        const char * query_sequence_ptr;

        std::vector<unsigned char> candidate_counts(sg.nodes.size()*2);

#pragma omp for schedule(static,1000) reduction(+:no_matches,single_matches,multi_matches,num_reads_done)
        for (uint32_t readID = 1; readID <= datastore.size(); ++readID) {
            if (++num_reads_done%10000 == 0) {
                sdglib::OutputLog() << "Thread #"<<omp_get_thread_num() <<" processing its read #" << num_reads_done << std::endl;
            }

            if ((!readIDs.empty() and readIDs.count(readID)==0 /*Read not in selected set*/)) {
                continue;
            }
            if (datastore.read_to_fileRecord[readID].record_size< 2 * min_size ) continue;
            //========== 1. Get read sequence, kmerise, get all matches ==========
            query_sequence_ptr = sequenceGetter.get_read_sequence(readID);
            read_kmers.clear();
            skf.produce_all_kmers(query_sequence_ptr, read_kmers);

            if ( read_kmers.size()< 2 * min_size) {
                continue;
            }

            if (sat_kmer_index) {
                get_sat_kmer_matches(*skindex,node_matches, read_kmers);
            } else {
                std::vector<bool> kmer_in_assembly(read_kmers.size());

                for (uint64_t i = 0; i < read_kmers.size(); ++i) {
                    kmer_in_assembly[i] = nkindex->filter(read_kmers[i].second);
                }
                get_all_kmer_matches(*nkindex, node_matches, read_kmers, kmer_in_assembly);
            }

            //========== 2. Find match candidates in fixed windows ==========

            count_candidates(candidate_counts, node_matches,read_kmers.size());

            //========== 3. Create alignment blocks from candidates ==========

            auto blocks(alignment_blocks(readID,node_matches,read_kmers.size(), candidate_counts));
            std::memset(candidate_counts.data(), 0, candidate_counts.size());

            //========== 4. Construct mapping path ==========
            if (blocks.empty()) ++no_matches;
            else if (blocks.size()==1) ++single_matches;
            else ++multi_matches;
            //TODO: align blocks that occupy the same space as longer/better blocks should be thrown away.

            //auto fblocks=filter_blocks(blocks,node_matches,read_kmers.size());
            const auto &fblocks = blocks;

//            std::cout<<"READ " << readID << " mappings, after FILTERING:"<<std::endl;
//            for (auto b:fblocks)
//                std::cout << "READ\tTarget: " << b.node << " (" << sdg.nodes[llabs(b.node)].sequence.size() << " bp)  "
//                          << b.qStart << ":" << b.qEnd << " -> " << b.nStart << ":" << b.nEnd
//                          << " (" << b.score << " chained hits, " << b.qEnd - b.qStart + k << "bp, "
//                          << b.score * 100 / (b.qEnd - b.qStart) << "%)"
//                          << std::endl;

            private_results.insert(private_results.end(),fblocks.begin(),fblocks.end());
        }
    }
    //TODO: report read and win coverage by winners vs. by loosers
//    sdglib::OutputLog()<<"Read window results:    "<<window_low_score<<" low score    "<<window_close_second<<" close second    "<<window_hit<<" hits"<<std::endl;
    sdglib::OutputLog()<<"Read results:    "<<no_matches<<" no match    "<<single_matches<<" single match    "<<multi_matches<<" multi matches"<<std::endl;
    for (auto & threadm : thread_mappings) {
        mappings.insert(mappings.end(),threadm.begin(),threadm.end());
    }
    sdglib::OutputLog() << "Updating mapping indexes" <<std::endl;
    update_indexes();
}